

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O2

bool __thiscall
slang::ast::ConstraintExprVisitor::visit<slang::ast::AssertionInstanceExpression>
          (ConstraintExprVisitor *this,AssertionInstanceExpression *expr)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  char cVar5;
  bool bVar6;
  RandMode RVar7;
  SubroutineKind SVar8;
  Symbol *pSVar9;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *ppSVar10;
  ExpressionKind EVar11;
  SourceLocation SVar12;
  long lVar13;
  DiagCode code;
  ASTContext *this_00;
  BinaryExpression *binExpr;
  SourceRange sourceRange;
  ArgList AVar15;
  DistVarVisitor distVisitor;
  SourceLocation SVar14;
  
  if ((this->failed != false) || (bVar4 = Expression::bad(&expr->super_Expression), bVar4))
  goto LAB_00204a43;
  pSVar9 = Expression::getSymbolReference(&expr->super_Expression,true);
  if ((pSVar9 != (Symbol *)0x0) &&
     (((RVar7 = ASTContext::getRandMode(this->context,pSVar9), RVar7 != None &&
       (this->sawRandVars = true, RVar7 == RandC)) && (this->isSoft != false)))) {
    ASTContext::addDiag(this->context,(DiagCode)0x390008,(expr->super_Expression).sourceRange);
  }
  EVar11 = (expr->super_Expression).kind;
  if ((EVar11 < Conversion) && ((0x340000U >> (EVar11 & ValueRange) & 1) != 0)) {
    cVar5 = '\0';
  }
  else {
    bVar4 = this->isTop;
    bVar6 = this->sawRandVars;
    this->isTop = false;
    this->sawRandVars = false;
    AssertionInstanceExpression::visitExprs<slang::ast::ConstraintExprVisitor&>(expr,this);
    cVar5 = this->sawRandVars;
    this->isTop = bVar4;
    this->sawRandVars = bVar6;
    EVar11 = (expr->super_Expression).kind;
  }
  bVar4 = true;
  switch(EVar11) {
  case IntegerLiteral:
    SVInt::SVInt((SVInt *)&distVisitor,(SVIntStorage *)&expr->body);
    goto LAB_002049cb;
  case RealLiteral:
  case TimeLiteral:
    this_00 = this->context;
    if (0 < (int)(((this_00->scope).ptr)->compilation->options).languageVersion) break;
    SVar14 = (expr->super_Expression).sourceRange.startLoc;
    SVar12 = (expr->super_Expression).sourceRange.endLoc;
    code.subsystem = Statements;
    code.code = 0x2f;
    goto LAB_00204908;
  case UnbasedUnsizedIntegerLiteral:
    UnbasedUnsizedIntegerLiteral::getValue((UnbasedUnsizedIntegerLiteral *)&distVisitor);
LAB_002049cb:
    SVInt::~SVInt((SVInt *)&distVisitor);
    if (distVisitor._13_1_ != '\x01') {
      return true;
    }
    this_00 = this->context;
    SVar14 = (expr->super_Expression).sourceRange.startLoc;
    SVar12 = (expr->super_Expression).sourceRange.endLoc;
    code.subsystem = Statements;
    code.code = 0x50;
    goto LAB_00204908;
  case NullLiteral:
  case UnboundedLiteral:
  case StringLiteral:
  case UnaryOp:
  case ConditionalOp:
  case Inside:
  case Assignment:
  case Concatenation:
  case Replication:
  case ElementSelect:
  case RangeSelect:
  case MemberAccess:
    break;
  case NamedValue:
  case HierarchicalValue:
    if (this->isTop == false) {
      return true;
    }
    break;
  case BinaryOp:
    uVar1 = *(uint *)&(expr->arguments)._M_ptr;
    if (uVar1 < 0x17) {
      if ((0x79e600U >> (uVar1 & 0x1f) & 1) == 0) {
        if ((0x61800U >> (uVar1 & 0x1f) & 1) != 0) goto switchD_002048b8_caseD_11;
      }
      else if ((cVar5 != '\0') &&
              ((((expr->symbol->kind & ~IntegerLiteral) == NamedValue &&
                (bVar6 = checkType(this,(Expression *)expr->symbol), !bVar6)) ||
               (((((Expression *)expr->body)->kind & ~IntegerLiteral) == NamedValue &&
                (bVar6 = checkType(this,(Expression *)expr->body), !bVar6)))))) goto LAB_00204a43;
    }
    break;
  case Streaming:
switchD_002048b8_caseD_11:
    this_00 = this->context;
    SVar14 = (expr->super_Expression).sourceRange.startLoc;
    SVar12 = (expr->super_Expression).sourceRange.endLoc;
    code.subsystem = Statements;
    code.code = 0x18;
LAB_00204908:
    sourceRange.endLoc = SVar12;
    sourceRange.startLoc = SVar14;
    ASTContext::addDiag(this_00,code,sourceRange);
    goto LAB_00204a43;
  case Call:
    SVar8 = CallExpression::getSubroutineKind((CallExpression *)expr);
    if (SVar8 == Task) {
      this_00 = this->context;
      SVar14 = (expr->super_Expression).sourceRange.startLoc;
      SVar12 = (expr->super_Expression).sourceRange.endLoc;
      code.subsystem = Statements;
      code.code = 0x4b;
      goto LAB_00204908;
    }
    if (expr->isRecursiveProperty != true) {
      ppSVar10 = std::
                 get<0ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                           ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                             *)&expr->symbol);
      AVar15 = SubroutineSymbol::getArguments(*ppSVar10);
      for (lVar13 = 0; AVar15._M_extent._M_extent_value._M_extent_value * 8 != lVar13;
          lVar13 = lVar13 + 8) {
        lVar3 = *(long *)((long)AVar15._M_ptr + lVar13);
        iVar2 = *(int *)(lVar3 + 0x158);
        if (iVar2 == 3) {
          if ((*(byte *)(lVar3 + 0x154) & 1) == 0) goto LAB_00204aab;
        }
        else if (iVar2 - 1U < 2) {
LAB_00204aab:
          this_00 = this->context;
          SVar14 = (expr->super_Expression).sourceRange.startLoc;
          SVar12 = (expr->super_Expression).sourceRange.endLoc;
          code.subsystem = Statements;
          code.code = 0x32;
          goto LAB_00204908;
        }
      }
    }
    break;
  default:
    switch(EVar11) {
    case ValueRange:
      return true;
    case Dist:
      distVisitor.context = this->context;
      distVisitor.anyRandVars = false;
      pSVar9 = expr->symbol;
      Expression::visit<slang::ast::DistVarVisitor&>((Expression *)pSVar9,&distVisitor);
      if (distVisitor.anyRandVars != false) {
        return true;
      }
      ASTContext::addDiag(this->context,(DiagCode)0x3c0008,*(SourceRange *)&pSVar9->parentScope);
      return true;
    case NewArray:
    case NewClass:
    case CopyClass:
      goto switchD_002048b8_caseD_11;
    }
  }
  bVar6 = checkType(this,&expr->super_Expression);
  if (!bVar6) {
LAB_00204a43:
    this->failed = true;
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool visit(const T& expr) {
        if (failed || expr.bad())
            return fail();

        if constexpr (std::is_base_of_v<Expression, T>) {
            if (auto sym = expr.getSymbolReference()) {
                RandMode mode = context.getRandMode(*sym);
                if (mode != RandMode::None)
                    sawRandVars = true;

                if (isSoft && mode == RandMode::RandC)
                    context.addDiag(diag::RandCInSoft, expr.sourceRange);
            }

            bool childrenHaveRand = false;

            if constexpr (HasVisitExprs<T, ConstraintExprVisitor>) {
                // Inside call and select expressions we don't care about the types.
                // This allows things like selections of associative arrays and built-in methods
                // on arrays of strings to work as long as the actual operators at the top level
                // don't have those types.
                if (expr.kind != ExpressionKind::ElementSelect &&
                    expr.kind != ExpressionKind::MemberAccess &&
                    expr.kind != ExpressionKind::Call) {

                    const bool oldTop = std::exchange(isTop, false);
                    const bool oldSawRand = std::exchange(sawRandVars, false);
                    expr.visitExprs(*this);
                    isTop = oldTop;
                    childrenHaveRand = sawRandVars;
                    sawRandVars = oldSawRand;
                }
            }

            switch (expr.kind) {
                case ExpressionKind::Streaming:
                case ExpressionKind::NewArray:
                case ExpressionKind::NewClass:
                case ExpressionKind::CopyClass:
                    context.addDiag(diag::ExprNotConstraint, expr.sourceRange);
                    return fail();
                case ExpressionKind::RealLiteral:
                case ExpressionKind::TimeLiteral:
                    if (context.getCompilation().languageVersion() < LanguageVersion::v1800_2023) {
                        context.addDiag(diag::NonIntegralConstraintLiteral, expr.sourceRange);
                        return fail();
                    }
                    break;
                case ExpressionKind::IntegerLiteral:
                    if (expr.template as<IntegerLiteral>().getValue().hasUnknown()) {
                        context.addDiag(diag::UnknownConstraintLiteral, expr.sourceRange);
                        return fail();
                    }
                    return true;
                case ExpressionKind::UnbasedUnsizedIntegerLiteral:
                    if (expr.template as<UnbasedUnsizedIntegerLiteral>().getValue().hasUnknown()) {
                        context.addDiag(diag::UnknownConstraintLiteral, expr.sourceRange);
                        return fail();
                    }
                    return true;
                case ExpressionKind::BinaryOp: {
                    auto& binExpr = expr.template as<BinaryExpression>();
                    switch (binExpr.op) {
                        case BinaryOperator::CaseEquality:
                        case BinaryOperator::CaseInequality:
                        case BinaryOperator::WildcardEquality:
                        case BinaryOperator::WildcardInequality:
                            context.addDiag(diag::ExprNotConstraint, expr.sourceRange);
                            return fail();
                        case BinaryOperator::Equality:
                        case BinaryOperator::Inequality:
                        case BinaryOperator::GreaterThanEqual:
                        case BinaryOperator::GreaterThan:
                        case BinaryOperator::LessThanEqual:
                        case BinaryOperator::LessThan:
                        case BinaryOperator::LogicalAnd:
                        case BinaryOperator::LogicalOr:
                        case BinaryOperator::LogicalImplication:
                        case BinaryOperator::LogicalEquivalence:
                            // We previously ignored invalid types of NamedValues when
                            // we visited subexpressions. If there were any rand vars
                            // used in our subexpressions we should re-check named values
                            // for the stricter integral / numeric type requirements.
                            if (childrenHaveRand) {
                                if (ValueExpressionBase::isKind(binExpr.left().kind) &&
                                    !checkType(binExpr.left())) {
                                    return fail();
                                }

                                if (ValueExpressionBase::isKind(binExpr.right().kind) &&
                                    !checkType(binExpr.right())) {
                                    return fail();
                                }
                            }
                            break;
                        default:
                            break;
                    }
                    break;
                }
                case ExpressionKind::NamedValue:
                case ExpressionKind::HierarchicalValue:
                    if (!isTop)
                        return true;
                    break;
                case ExpressionKind::ValueRange:
                    return true;
                case ExpressionKind::Dist: {
                    // Additional restrictions on dist expressions:
                    // - must contain at least one 'rand' var
                    // - cannot contain any 'randc' vars
                    DistVarVisitor distVisitor(context);
                    auto& left = expr.template as<DistExpression>().left();
                    left.visit(distVisitor);
                    if (!distVisitor.anyRandVars)
                        context.addDiag(diag::RandNeededInDist, left.sourceRange);
                    return true;
                }
                case ExpressionKind::Call: {
                    auto& call = expr.template as<CallExpression>();
                    if (call.getSubroutineKind() == SubroutineKind::Task) {
                        context.addDiag(diag::TaskInConstraint, expr.sourceRange);
                        return fail();
                    }

                    if (!call.isSystemCall()) {
                        const SubroutineSymbol& sub = *std::get<0>(call.subroutine);
                        for (auto arg : sub.getArguments()) {
                            if (arg->direction == ArgumentDirection::Out ||
                                arg->direction == ArgumentDirection::InOut ||
                                (arg->direction == ArgumentDirection::Ref &&
                                 !arg->flags.has(VariableFlags::Const))) {
                                context.addDiag(diag::OutRefFuncConstraint, expr.sourceRange);
                                return fail();
                            }
                        }
                    }
                    break;
                }
                default:
                    break;
            }

            if (!checkType(expr))
                return fail();
        }

        return true;
    }